

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void * __thiscall
google::protobuf::anon_unknown_1::TableArena::AllocRawInternal
          (TableArena *this,uint32_t size,Tag tag)

{
  pointer *ppRVar1;
  ushort uVar2;
  ushort uVar3;
  size_t i;
  long lVar4;
  Block *pBVar5;
  ulong uVar6;
  pointer pRVar7;
  LogMessage *pLVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  uint uVar10;
  Block *res;
  Block *to_relocate;
  size_t __n;
  pointer pRVar11;
  LogFinisher local_bd;
  undefined4 local_bc;
  pointer local_b8;
  long local_b0;
  _Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_bc = (undefined4)CONCAT71(in_register_00000011,tag);
  uVar10 = size + 7 & 0xfffffff8;
  lVar4 = 0;
  while ((pBVar5 = (this->small_size_blocks_)._M_elems[lVar4], pBVar5 == (Block *)0x0 ||
         ((byte)(&(anonymous_namespace)::TableArena::kSmallSizes)[lVar4] < uVar10))) {
    lVar4 = lVar4 + 1;
    if (lVar4 == 6) {
      pBVar5 = (Block *)0x0;
LAB_003686a9:
      to_relocate = pBVar5;
      if (pBVar5 == (Block *)0x0) {
        to_relocate = this->current_;
        if ((to_relocate == (Block *)0x0) ||
           ((uint)to_relocate->end_offset - (uint)to_relocate->start_offset <= uVar10)) {
          pBVar5 = (Block *)operator_new(0x1000);
          pBVar5->start_offset = 0;
          pBVar5->end_offset = 0xff0;
          pBVar5->capacity = 0xff0;
          pBVar5->next = (Block *)0x0;
          this->current_ = pBVar5;
          if (0xfef < size + 7) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x349);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (current_->space_left()) >= (size + 1): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
            internal::LogMessage::~LogMessage(&local_68);
          }
        }
        else {
          pBVar5 = to_relocate;
          to_relocate = (Block *)0x0;
        }
      }
      this->num_allocations_ = this->num_allocations_ + 1;
      pRVar7 = (this->rollback_info_).
               super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar11 = (this->rollback_info_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((pRVar7 == pRVar11) || (pRVar11[-1].block != pBVar5)) {
        if (pRVar11 ==
            (this->rollback_info_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __n = (long)pRVar11 - (long)pRVar7;
          if (__n == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar9 = (long)__n >> 4;
          uVar6 = 1;
          if (pRVar7 != pRVar11) {
            uVar6 = uVar9;
          }
          local_a8 = (_Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                      *)(uVar6 + uVar9);
          if ((_Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
               *)0x7fffffffffffffe < local_a8) {
            local_a8 = (_Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                        *)0x7ffffffffffffff;
          }
          if (CARRY8(uVar6,uVar9)) {
            local_a8 = (_Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                        *)0x7ffffffffffffff;
          }
          local_b8 = pRVar7;
          pRVar7 = std::
                   _Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                   ::_M_allocate(local_a8,(size_t)pRVar7);
          local_b0 = (long)pRVar7 + __n;
          *(Block **)((long)pRVar7 + __n) = pBVar5;
          *(undefined8 *)((long)pRVar7 + __n + 8) = 1;
          if (0 < (long)__n) {
            memmove(pRVar7,local_b8,__n);
          }
          pRVar11 = (pointer)(local_b0 + 0x10);
          if (local_b8 != (pointer)0x0) {
            operator_delete(local_b8);
          }
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_start = pRVar7;
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar11;
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar7 + (long)local_a8;
        }
        else {
          pRVar11->block = pBVar5;
          pRVar11->count = 1;
          ppRVar1 = &(this->rollback_info_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      else {
        pRVar11[-1].count = pRVar11[-1].count + 1;
      }
      if ((uint)pBVar5->end_offset - (uint)pBVar5->start_offset <= uVar10) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x3cb);
        pLVar8 = internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (n + 1) <= (space_left()): ");
        internal::LogFinisher::operator=(&local_bd,pLVar8);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      uVar2 = pBVar5->start_offset;
      pBVar5->start_offset = (short)uVar10 + uVar2;
      uVar3 = pBVar5->end_offset - 1;
      pBVar5->end_offset = uVar3;
      *(char *)((long)&pBVar5[1].start_offset + (ulong)uVar3) = (char)local_bc;
      if (to_relocate != (Block *)0x0) {
        RelocateToUsedList(this,to_relocate);
      }
      return (void *)((long)&pBVar5[1].start_offset + (ulong)uVar2);
    }
  }
  (this->small_size_blocks_)._M_elems[lVar4] = pBVar5->next;
  goto LAB_003686a9;
}

Assistant:

void* AllocRawInternal(uint32_t size, Tag tag) {
    GOOGLE_DCHECK_GT(size, 0);
    size = RoundUp(size);

    Block* to_relocate = nullptr;
    Block* to_use = nullptr;

    for (size_t i = 0; i < kSmallSizes.size(); ++i) {
      if (small_size_blocks_[i] != nullptr && size <= kSmallSizes[i]) {
        to_use = to_relocate = PopBlock(small_size_blocks_[i]);
        break;
      }
    }

    if (to_relocate != nullptr) {
      // We found one in the loop.
    } else if (current_ != nullptr && size + 1 <= current_->space_left()) {
      to_use = current_;
    } else {
      // No space left anywhere, make a new block.
      to_relocate = current_;
      // For now we hardcode the size to one page. Note that the maximum we can
      // allocate in the block according to the limits of Tag is less than 2k,
      // so this can fit anything that Tag can represent.
      constexpr size_t kBlockSize = 4096;
      to_use = current_ = ::new (::operator new(kBlockSize)) Block(kBlockSize);
      GOOGLE_DCHECK_GE(current_->space_left(), size + 1);
    }

    ++num_allocations_;
    if (!rollback_info_.empty() && rollback_info_.back().block == to_use) {
      ++rollback_info_.back().count;
    } else {
      rollback_info_.push_back({to_use, 1});
    }

    void* p = to_use->Allocate(size, tag);
    if (to_relocate != nullptr) {
      RelocateToUsedList(to_relocate);
    }
    return p;
  }